

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O2

void basisu::add_image(imagef *src1,imagef *src2,imagef *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec4F *pvVar7;
  vec4F *pvVar8;
  vec4F *pvVar9;
  int y;
  uint32_t y_00;
  uint32_t x;
  uint x_00;
  vec4F local_48;
  
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 1.0;
  imagef::resize(dst,src1,0xffffffff,&local_48);
  for (y_00 = 0; (int)y_00 < (int)dst->m_height; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < dst->m_width; x_00 = x_00 + 1) {
      pvVar7 = imagef::operator()(src1,x_00,y_00);
      pvVar8 = imagef::operator()(src2,x_00,y_00);
      pvVar9 = imagef::operator()(dst,x_00,y_00);
      fVar1 = pvVar7->m_v[1];
      fVar2 = pvVar7->m_v[2];
      fVar3 = pvVar7->m_v[3];
      fVar4 = pvVar8->m_v[1];
      fVar5 = pvVar8->m_v[2];
      fVar6 = pvVar8->m_v[3];
      pvVar9->m_v[0] = pvVar8->m_v[0] + pvVar7->m_v[0];
      pvVar9->m_v[1] = fVar4 + fVar1;
      pvVar9->m_v[2] = fVar5 + fVar2;
      pvVar9->m_v[3] = fVar6 + fVar3;
    }
  }
  return;
}

Assistant:

void add_image(const imagef &src1, const imagef &src2, imagef &dst)
	{
		dst.resize(src1);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &s1 = src1(x, y);
				const vec4F &s2 = src2(x, y);

				dst(x, y).set(s1[0] + s2[0], s1[1] + s2[1], s1[2] + s2[2], s1[3] + s2[3]);
			}
		}
	}